

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O3

ValuedAction __thiscall
despot::DefaultPolicy::Value
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  DSPOMDP *pDVar1;
  int iVar2;
  pointer ppSVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ValuedAction VVar5;
  ValuedAction VVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  State *local_38;
  
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar3) {
    uVar4 = 0;
    do {
      pDVar1 = (this->super_ScenarioLowerBound).model_;
      iVar2 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,ppSVar3[uVar4]);
      local_38 = (State *)CONCAT44(extraout_var,iVar2);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&local_58,&local_38);
      uVar4 = uVar4 + 1;
      ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  this->initial_depth_ =
       (int)((ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  VVar5 = RecursiveValue(this,&local_58,streams,history);
  VVar6.action = VVar5.action;
  if (local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      pDVar1 = (this->super_ScenarioLowerBound).model_;
      (*pDVar1->_vptr_DSPOMDP[0x17])
                (pDVar1,local_58.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_58.
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  VVar6._4_4_ = 0;
  VVar6.value = VVar5.value;
  return VVar6;
}

Assistant:

ValuedAction DefaultPolicy::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(model_->Copy(particles[i]));

	initial_depth_ = history.Size();
	ValuedAction va = RecursiveValue(copy, streams, history);

	for (int i = 0; i < copy.size(); i++)
		model_->Free(copy[i]);

	return va;
}